

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

void __thiscall
slang::ast::EventListControl::serializeTo(EventListControl *this,ASTSerializer *serializer)

{
  iterator ppTVar1;
  TimingControl *event;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::TimingControl_*const,_18446744073709551615UL> *__range2;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  EventListControl *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"events");
  ASTSerializer::startArray(serializer,___range2);
  __end2 = nonstd::span_lite::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>::
           begin(&this->events);
  ppTVar1 = nonstd::span_lite::span<const_slang::ast::TimingControl_*const,_18446744073709551615UL>
            ::end(&this->events);
  for (; __end2 != ppTVar1; __end2 = __end2 + 1) {
    ASTSerializer::serialize(local_18,*__end2);
  }
  ASTSerializer::endArray(local_18);
  return;
}

Assistant:

void EventListControl::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("events");
    for (auto const event : events) {
        serializer.serialize(*event);
    }
    serializer.endArray();
}